

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O2

bool __thiscall QVariant::view(QVariant *this,int type,void *ptr)

{
  ulong uVar1;
  bool bVar2;
  void *from;
  long in_FS_OFFSET;
  QMetaType local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  uVar1 = *(ulong *)&(this->d).field_0x18;
  from = data(this);
  QMetaType::QMetaType(&local_38,type);
  bVar2 = QMetaType::view((QMetaTypeInterface *)(uVar1 & 0xfffffffffffffffc),from,local_38,ptr);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QVariant::view(int type, void *ptr)
{
    return QMetaType::view(d.type(), data(), QMetaType(type), ptr);
}